

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O1

void test_abs<int>(uint length)

{
  bool bVar1;
  int iVar2;
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> extraout_XMM0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var8;
  shared_ptr<int> pv;
  
  iVar2 = posix_memalign(&pv.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
                         0x10,(long)(int)length * 4);
  if (iVar2 != 0) {
    pv.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<int*,void(*)(int*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv,
             pv.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             sse::common::free<int>);
  if (0 < (int)length) {
    lVar6 = 0;
    p_Var4 = pv.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    do {
      *(int *)&p_Var4->_vptr__Sp_counted_base = (int)lVar6;
      lVar6 = lVar6 + -1;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var4->_vptr__Sp_counted_base + 4);
    } while (-lVar6 != (ulong)length);
  }
  iVar2 = (int)length >> 2;
  p_Var4 = pv.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  _Var8 = extraout_XMM0;
  iVar7 = iVar2;
  if (3 < iVar2) {
    do {
      _Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
              pabsd((undefined1  [16])_Var8,(undefined1  [16])*p_Var4);
      *p_Var4 = _Var8;
      _Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
              pabsd((undefined1  [16])_Var8,(undefined1  [16])p_Var4[1]);
      p_Var4[1] = _Var8;
      _Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
              pabsd((undefined1  [16])_Var8,(undefined1  [16])p_Var4[2]);
      p_Var4[2] = _Var8;
      _Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
              pabsd((undefined1  [16])_Var8,(undefined1  [16])p_Var4[3]);
      p_Var4[3] = _Var8;
      iVar2 = iVar7 + -4;
      p_Var4 = p_Var4 + 4;
      bVar1 = 7 < iVar7;
      iVar7 = iVar2;
    } while (bVar1);
  }
  if (1 < iVar2) {
    _Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
            pabsd((undefined1  [16])_Var8,(undefined1  [16])*p_Var4);
    *p_Var4 = _Var8;
    _Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
            pabsd((undefined1  [16])_Var8,(undefined1  [16])p_Var4[1]);
    p_Var4[1] = _Var8;
    iVar2 = iVar2 + -2;
    p_Var4 = p_Var4 + 2;
  }
  if (iVar2 != 0) {
    _Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
            pabsd((undefined1  [16])_Var8,(undefined1  [16])*p_Var4);
    *p_Var4 = _Var8;
  }
  if ((length & 0xfffffffc) != length) {
    lVar6 = (long)(int)(length & 0xfffffffc);
    do {
      iVar2 = *(int *)((long)&(pv.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi)->_vptr__Sp_counted_base + lVar6 * 4);
      iVar7 = -iVar2;
      if (0 < iVar2) {
        iVar7 = iVar2;
      }
      *(int *)((long)&(pv.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base + lVar6 * 4) = iVar7;
      lVar6 = lVar6 + 1;
    } while (lVar6 < (int)length);
  }
  if (0 < (int)length) {
    uVar5 = 0;
    do {
      if (0x80000000 <
          *(uint *)((long)&(pv.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                           )->_vptr__Sp_counted_base + uVar5 * 4)) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar3 = "void test_abs(unsigned int) [T = int]";
        *(undefined4 *)(puVar3 + 1) = 0x81;
        *(uint *)((long)puVar3 + 0xc) = length;
        __cxa_throw(puVar3,&Exception::typeinfo,0);
      }
      uVar5 = uVar5 + 1;
    } while (length != uVar5);
  }
  if (pv.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_abs(unsigned length = 47)
{
    auto pv = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    T * v = pv.get();

    for (int i = 0; i < (int)length; ++i)
        v[i] = -i;

    simd::abs(v, v, length);

    for (int i = 0; i < (int)length; ++i)
    {
        if (v[i] < 0 && v[i] != std::numeric_limits<T>::min())
            FAIL();
    }
}